

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

bool __thiscall minihttp::TcpSocket::update(TcpSocket *this)

{
  bool bVar1;
  uint uVar2;
  int __fd;
  uint local_2c;
  int err;
  int bytes;
  TcpSocket *this_local;
  uchar *buf;
  
  uVar2 = (*this->_vptr_TcpSocket[8])();
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = isOpen(this);
    if (bVar1) {
      if (this->_inbuf == (char *)0x0) {
        SetBufsizeIn(this,0x1000);
      }
      buf = (uchar *)this->_writeptr;
      local_2c = _readBytes(this,buf,(ulong)this->_writeSize);
      __fd = (int)buf;
      if ((int)local_2c < 1) {
        if (local_2c == 0) {
          close(this,__fd);
        }
        else {
          if (local_2c == 0xffffffff) {
            local_2c = _GetError();
          }
          if (local_2c == 0xb) {
            return false;
          }
          close(this,__fd);
        }
      }
      else {
        this->_inbuf[(int)local_2c] = '\0';
        this->_recvSize = local_2c;
        this->_writeSize = this->_inbufSize - 1;
        this->_writeptr = this->_inbuf;
        this->_readptr = this->_inbuf;
        (*this->_vptr_TcpSocket[4])();
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TcpSocket::update(void)
{
   if(!_OnUpdate())
       return false;

   if(!isOpen())
       return false;

    if(!_inbuf)
        SetBufsizeIn(DEFAULT_BUFSIZE);

    int bytes = _readBytes((unsigned char*)_writeptr, _writeSize);
    //traceprint("TcpSocket::update: _readBytes() result %d\n", bytes);
    if(bytes > 0) // we received something
    {
        _inbuf[bytes] = 0;
        _recvSize = bytes;

        // reset pointers for next read
        _writeSize = _inbufSize - 1;
        _readptr = _writeptr = _inbuf;

        _OnData();
    }
    else if(bytes == 0) // remote has closed the connection
    {
        close();
    }
    else // whoops, error?
    {
        // Possible that the error is returned directly (in that case, < -1, or -1 is returned and the error has to be retrieved seperately.
        // But in the latter case, error numbers may be positive (at least on windows...)
        int err = bytes == -1 ? _GetError() : bytes;
        switch(err)
        {
        case EWOULDBLOCK:
#if defined(EAGAIN) && (EWOULDBLOCK != EAGAIN)
        case EAGAIN: // linux man pages say this can also happen instead of EWOULDBLOCK
#endif
            return false;

#ifdef MINIHTTP_USE_MBEDTLS
        case MBEDTLS_ERR_SSL_WANT_READ:
            break; // Try again later
#endif

        default:
            traceprint("SOCKET UPDATE ERROR: (%d): %s\n", err, _GetErrorStr(err).c_str());
        case ECONNRESET:
        case ENOTCONN:
        case ETIMEDOUT:
#ifdef _WIN32
        case WSAECONNABORTED:
        case WSAESHUTDOWN:
#endif
            close();
            break;
        }
    }
    return true;
}